

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf-cursor.c
# Opt level: O3

int coda_netcdf_cursor_goto_attributes(coda_cursor *cursor)

{
  long *plVar1;
  coda_dynamic_type_struct *pcVar2;
  coda_dynamic_type *pcVar3;
  long lVar4;
  
  lVar4 = (long)cursor->n;
  pcVar2 = cursor->stack[lVar4 + -1].type;
  cursor->n = cursor->n + 1;
  pcVar2 = *(coda_dynamic_type_struct **)(pcVar2 + 1);
  if (pcVar2 == (coda_dynamic_type_struct *)0x0) {
    pcVar3 = coda_mem_empty_record(coda_format_netcdf);
    lVar4 = (long)cursor->n + -1;
    cursor->stack[(long)cursor->n + -1].type = pcVar3;
  }
  else {
    cursor->stack[lVar4].type = pcVar2;
  }
  plVar1 = &cursor->stack[lVar4].index;
  *(undefined4 *)plVar1 = 0xffffffff;
  *(undefined4 *)((long)plVar1 + 4) = 0xffffffff;
  *(undefined4 *)(plVar1 + 1) = 0xffffffff;
  *(undefined4 *)((long)plVar1 + 0xc) = 0xffffffff;
  return 0;
}

Assistant:

int coda_netcdf_cursor_goto_attributes(coda_cursor *cursor)
{
    coda_netcdf_type *type;

    type = (coda_netcdf_type *)cursor->stack[cursor->n - 1].type;
    cursor->n++;
    if (type->attributes != NULL)
    {
        cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)type->attributes;
    }
    else
    {
        cursor->stack[cursor->n - 1].type = coda_mem_empty_record(coda_format_netcdf);
    }
    /* we use the special index value '-1' to indicate that we are pointing to the attributes of the parent */
    cursor->stack[cursor->n - 1].index = -1;
    cursor->stack[cursor->n - 1].bit_offset = -1;       /* not applicable for netCDF backend */

    return 0;
}